

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

bdecode_node * __thiscall
libtorrent::bdecode_node::dict_find
          (bdecode_node *__return_storage_ptr__,bdecode_node *this,string_view key)

{
  bdecode_token *tokens_00;
  char *pcVar1;
  bdecode_token bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bdecode_token *t_00;
  size_type sVar7;
  const_pointer __first1;
  const_pointer pvVar8;
  int size;
  bdecode_token *t;
  int token;
  bdecode_token *tokens;
  bdecode_node *this_local;
  string_view key_local;
  
  key_local._M_len = (size_t)key._M_str;
  this_local = (bdecode_node *)key._M_len;
  tokens_00 = this->m_root_tokens;
  t._4_4_ = this->m_token_idx + 1;
  key_local._M_str = (char *)__return_storage_ptr__;
  do {
    if (((uint)((ulong)tokens_00[t._4_4_] >> 0x1d) & 7) == 6) {
      memset(__return_storage_ptr__,0,0x40);
      bdecode_node(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    t_00 = tokens_00 + t._4_4_;
    iVar4 = anon_unknown_8::token_source_span(t_00);
    iVar5 = libtorrent::aux::bdecode_token::start_offset(t_00);
    sVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if ((int)sVar7 == iVar4 - iVar5) {
      __first1 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pvVar8 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pcVar1 = this->m_buffer;
      bVar2 = *t_00;
      iVar6 = libtorrent::aux::bdecode_token::start_offset(t_00);
      bVar3 = ::std::equal<char_const*,char_const*>
                        (__first1,pvVar8 + (iVar4 - iVar5),
                         pcVar1 + (long)iVar6 + (long)(int)(bVar2._0_4_ & 0x1fffffff));
      if (bVar3) {
        bdecode_node(__return_storage_ptr__,tokens_00,this->m_buffer,this->m_buffer_size,
                     (SUB84(*t_00,4) & 0x1fffffff) + t._4_4_);
        return __return_storage_ptr__;
      }
    }
    iVar4 = (SUB84(*t_00,4) & 0x1fffffff) + t._4_4_;
    t._4_4_ = (SUB84(tokens_00[iVar4],4) & 0x1fffffff) + iVar4;
  } while( true );
}

Assistant:

bdecode_node bdecode_node::dict_find(string_view key) const
	{
		TORRENT_ASSERT(type() == dict_t);

		bdecode_token const* const tokens = m_root_tokens;

		// this is the first item
		int token = m_token_idx + 1;

		while (tokens[token].type != bdecode_token::end)
		{
			bdecode_token const& t = tokens[token];
			TORRENT_ASSERT(t.type == bdecode_token::string
				|| t.type == bdecode_token::long_string);
			int const size = token_source_span(t) - t.start_offset();
			if (int(key.size()) == size
				&& std::equal(key.data(), key.data() + size, m_buffer
					+ t.offset + t.start_offset()))
			{
				// skip key
				token += t.next_item;
				TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

				return bdecode_node(tokens, m_buffer, m_buffer_size, token);
			}

			// skip key
			token += t.next_item;
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

			// skip value
			token += tokens[token].next_item;
		}

		return bdecode_node();
	}